

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void relaxSemiVariables(HighsLp *lp,bool *made_semi_variable_mods)

{
  iterator __position;
  iterator __position_00;
  int iVar1;
  long lVar2;
  pointer pdVar3;
  int local_2c;
  
  *made_semi_variable_mods = false;
  if ((lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2c = 0;
    iVar1 = lp->num_col_;
    if (0 < iVar1) {
      do {
        if (((lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start[local_2c] & ~kInteger) == kSemiContinuous) {
          __position._M_current =
               (lp->mods_).save_relaxed_semi_variable_lower_bound_index.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position._M_current ==
              (lp->mods_).save_relaxed_semi_variable_lower_bound_index.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)
                       &(lp->mods_).save_relaxed_semi_variable_lower_bound_index,__position,
                       &local_2c);
          }
          else {
            *__position._M_current = local_2c;
            (lp->mods_).save_relaxed_semi_variable_lower_bound_index.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
                 = __position._M_current + 1;
          }
          lVar2 = (long)local_2c;
          pdVar3 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          __position_00._M_current =
               (lp->mods_).save_relaxed_semi_variable_lower_bound_value.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position_00._M_current ==
              (lp->mods_).save_relaxed_semi_variable_lower_bound_value.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)
                       &(lp->mods_).save_relaxed_semi_variable_lower_bound_value,__position_00,
                       pdVar3 + lVar2);
            pdVar3 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar2 = (long)local_2c;
          }
          else {
            *__position_00._M_current = pdVar3[lVar2];
            (lp->mods_).save_relaxed_semi_variable_lower_bound_value.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = __position_00._M_current + 1;
          }
          pdVar3[lVar2] = 0.0;
          iVar1 = lp->num_col_;
        }
        local_2c = local_2c + 1;
      } while (local_2c < iVar1);
    }
    *made_semi_variable_mods =
         (lp->mods_).save_relaxed_semi_variable_lower_bound_index.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
         (lp->mods_).save_relaxed_semi_variable_lower_bound_index.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void relaxSemiVariables(HighsLp& lp, bool& made_semi_variable_mods) {
  // When solving relaxation, semi-variables are continuous between 0
  // and their upper bound, so have to modify the lower bound to be
  // zero
  made_semi_variable_mods = false;
  if (!lp.integrality_.size()) return;
  assert((HighsInt)lp.integrality_.size() == lp.num_col_);
  std::vector<HighsInt>& relaxed_semi_variable_lower_index =
      lp.mods_.save_relaxed_semi_variable_lower_bound_index;
  std::vector<double>& relaxed_semi_variable_lower_value =
      lp.mods_.save_relaxed_semi_variable_lower_bound_value;
  assert(relaxed_semi_variable_lower_index.size() == 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      relaxed_semi_variable_lower_index.push_back(iCol);
      relaxed_semi_variable_lower_value.push_back(lp.col_lower_[iCol]);
      lp.col_lower_[iCol] = 0;
    }
  }
  made_semi_variable_mods = relaxed_semi_variable_lower_index.size() > 0;
}